

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase_real.hpp
# Opt level: O1

void __thiscall
soplex::
SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::writeLPF(SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,ostream *p_output,NameSet *p_rnames,NameSet *p_cnames,DIdxSet *p_intvars,
          bool writeZeroObjective)

{
  undefined8 *puVar1;
  uint *puVar2;
  pointer pnVar3;
  undefined8 uVar4;
  bool bVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  int iVar12;
  int iVar13;
  size_t sVar14;
  ostream *poVar15;
  Item *pIVar16;
  long lVar17;
  uint uVar18;
  ulong uVar19;
  char *pcVar20;
  cpp_dec_float<100U,_int,_void> *p_lhs;
  undefined7 in_register_00000089;
  int iVar21;
  long lVar22;
  double dVar23;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar24;
  long lVar25;
  long in_FS_OFFSET;
  char name_2 [16];
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  svec;
  char name_1 [16];
  char name [16];
  cpp_dec_float<100U,_int,_void> local_1c8;
  undefined1 local_178 [8];
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  SStack_170;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNStack_160;
  uint local_158 [2];
  uint auStack_150 [2];
  uint local_148 [2];
  uint auStack_140 [2];
  int local_138;
  bool local_134;
  fpclass_type local_130;
  IdxSet *local_120;
  cpp_dec_float<100U,_int,_void> local_118;
  double local_c8;
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  NameSet *local_b8;
  undefined8 uStack_b0;
  double local_a8;
  undefined8 uStack_a0;
  cpp_dec_float<100U,_int,_void> local_98;
  char local_48 [24];
  
  local_a8 = (double)CONCAT44(local_a8._4_4_,(int)CONCAT71(in_register_00000089,writeZeroObjective))
  ;
  lVar22 = *(long *)p_output;
  *(undefined8 *)(p_output + *(long *)(lVar22 + -0x18) + 8) = 0x10;
  lVar22 = *(long *)(lVar22 + -0x18);
  *(uint *)(p_output + lVar22 + 0x18) = *(uint *)(p_output + lVar22 + 0x18) & 0xfffffefb | 0x100;
  dVar23 = (double)(long)this->thesense;
  pcVar20 = "Maximize\n";
  if (dVar23 == -NAN) {
    pcVar20 = "Minimize\n";
  }
  local_120 = &p_intvars->super_IdxSet;
  local_b8 = p_rnames;
  std::__ostream_insert<char,std::char_traits<char>>(p_output,pcVar20,9);
  std::__ostream_insert<char,std::char_traits<char>>(p_output,"  obj: ",7);
  iVar12 = (int)((ulong)((long)(this->
                               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               ).object.val.
                               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->
                              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ).object.val.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x33333333;
  SStack_170.m_elem =
       (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        *)0x0;
  SStack_170.memsize = 0;
  SStack_170.memused = 0;
  local_178 = (undefined1  [8])&PTR__DSVectorBase_006b0b50;
  pNStack_160 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)0x0;
  iVar21 = 2;
  if (0 < iVar12) {
    iVar21 = iVar12;
  }
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::allocMem((DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *)local_178,iVar21);
  SStack_170._8_8_ = SStack_170._8_8_ & 0xffffffff;
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::setMax((DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *)local_178,
           (int)((ulong)((long)(this->
                               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               ).object.val.
                               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->
                              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ).object.val.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x33333333);
  SStack_170._8_8_ = SStack_170._8_8_ & 0xffffffff;
  uVar18 = (int)((long)(this->
                       super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).object.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->
                       super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).object.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x33333333;
  local_c8 = dVar23;
  if ((int)uVar18 < 1) {
    iVar21 = 0;
  }
  else {
    uVar19 = (ulong)(uVar18 & 0x7fffffff);
    iVar21 = 0;
    pNVar24 = SStack_170.m_elem;
    lVar22 = uVar19 * 0x50;
    do {
      pnVar3 = (this->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).object.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (*(int *)((long)&pnVar3[-1].m_backend.data + lVar22 + 0x48) == 2) {
LAB_00380afd:
        pNVar24->idx = (int)uVar19 + -1;
        pnVar3 = (this->
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).object.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        puVar1 = (undefined8 *)((long)&pnVar3[-1].m_backend.data + lVar22);
        uVar4 = *puVar1;
        uVar6 = puVar1[1];
        puVar1 = (undefined8 *)((long)&pnVar3[-1].m_backend.data + lVar22 + 0x10);
        uVar7 = *puVar1;
        uVar8 = puVar1[1];
        puVar1 = (undefined8 *)((long)&pnVar3[-1].m_backend.data + lVar22 + 0x20);
        uVar9 = *puVar1;
        uVar10 = puVar1[1];
        puVar1 = (undefined8 *)((long)&pnVar3[-1].m_backend.data + lVar22 + 0x30);
        uVar11 = puVar1[1];
        *(undefined8 *)((pNVar24->val).m_backend.data._M_elems + 0xc) = *puVar1;
        *(undefined8 *)((pNVar24->val).m_backend.data._M_elems + 0xe) = uVar11;
        *(undefined8 *)((pNVar24->val).m_backend.data._M_elems + 8) = uVar9;
        *(undefined8 *)((pNVar24->val).m_backend.data._M_elems + 10) = uVar10;
        *(undefined8 *)((pNVar24->val).m_backend.data._M_elems + 4) = uVar7;
        *(undefined8 *)((pNVar24->val).m_backend.data._M_elems + 6) = uVar8;
        *(undefined8 *)(pNVar24->val).m_backend.data._M_elems = uVar4;
        *(undefined8 *)((pNVar24->val).m_backend.data._M_elems + 2) = uVar6;
        (pNVar24->val).m_backend.exp = *(int *)((long)&pnVar3[-1].m_backend.data + lVar22 + 0x40);
        (pNVar24->val).m_backend.neg = *(bool *)((long)&pnVar3[-1].m_backend.data + lVar22 + 0x44);
        uVar4 = *(undefined8 *)((long)&pnVar3[-1].m_backend.data + lVar22 + 0x48);
        (pNVar24->val).m_backend.fpclass = (int)uVar4;
        (pNVar24->val).m_backend.prec_elem = (int)((ulong)uVar4 >> 0x20);
        pNVar24 = pNVar24 + 1;
        iVar21 = iVar21 + 1;
      }
      else {
        local_1c8.fpclass = cpp_dec_float_finite;
        local_1c8.prec_elem = 0x10;
        local_1c8.data._M_elems[0] = 0;
        local_1c8.data._M_elems[1] = 0;
        local_1c8.data._M_elems[2] = 0;
        local_1c8.data._M_elems[3] = 0;
        local_1c8.data._M_elems[4] = 0;
        local_1c8.data._M_elems[5] = 0;
        local_1c8.data._M_elems[6] = 0;
        local_1c8.data._M_elems[7] = 0;
        local_1c8.data._M_elems[8] = 0;
        local_1c8.data._M_elems[9] = 0;
        local_1c8.data._M_elems[10] = 0;
        local_1c8.data._M_elems[0xb] = 0;
        local_1c8.data._M_elems[0xc] = 0;
        local_1c8.data._M_elems[0xd] = 0;
        local_1c8.data._M_elems._56_5_ = 0;
        local_1c8.data._M_elems[0xf]._1_3_ = 0;
        local_1c8.exp = 0;
        local_1c8.neg = false;
        iVar12 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                           ((cpp_dec_float<100U,_int,_void> *)
                            ((long)&pnVar3[-1].m_backend.data + lVar22),&local_1c8);
        if (iVar12 != 0) goto LAB_00380afd;
      }
      bVar5 = 1 < (long)uVar19;
      uVar19 = uVar19 - 1;
      lVar22 = lVar22 + -0x50;
    } while (bVar5);
  }
  SStack_170.memused = iVar21;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
            (&local_1c8,(longlong)local_c8,(type *)0x0);
  if (SStack_170.memused != 0) {
    pNVar24 = SStack_170.m_elem;
    uVar18 = SStack_170.memused;
    do {
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=
                ((cpp_dec_float<100U,_int,_void> *)pNVar24,&local_1c8);
      pNVar24 = pNVar24 + 1;
      uVar18 = uVar18 - 1;
    } while (uVar18 != 0);
  }
  LPFwriteSVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
            (this,p_output,p_cnames,&SStack_170,local_a8._0_1_);
  std::__ostream_insert<char,std::char_traits<char>>(p_output,"\n",1);
  local_178 = (undefined1  [8])&PTR__DSVectorBase_006b0b50;
  if (pNStack_160 !=
      (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       *)0x0) {
    free(pNStack_160);
    pNStack_160 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)0x0;
  }
  std::__ostream_insert<char,std::char_traits<char>>(p_output,"Subject To\n",0xb);
  iVar21 = (int)p_output;
  if (0 < (this->
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum) {
    local_a8 = *(double *)(in_FS_OFFSET + -8);
    uStack_a0 = 0;
    local_c8 = -local_a8;
    uStack_c0 = 0;
    uStack_bc = 0x80000000;
    lVar22 = 9;
    lVar25 = 0;
    do {
      pnVar3 = (this->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).left.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      puVar2 = (uint *)((long)&(pnVar3->m_backend).data + lVar22 * 8 + -0x48);
      local_1c8.data._M_elems._0_8_ = *(undefined8 *)puVar2;
      local_1c8.data._M_elems._8_8_ = *(undefined8 *)(puVar2 + 2);
      puVar2 = (uint *)((long)&(pnVar3->m_backend).data + lVar22 * 8 + -0x38);
      local_1c8.data._M_elems._16_8_ = *(undefined8 *)puVar2;
      local_1c8.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
      puVar2 = (uint *)((long)&(pnVar3->m_backend).data + lVar22 * 8 + -0x28);
      local_1c8.data._M_elems._32_8_ = *(undefined8 *)puVar2;
      local_1c8.data._M_elems._40_8_ = *(undefined8 *)(puVar2 + 2);
      puVar2 = (uint *)((long)&(pnVar3->m_backend).data + lVar22 * 8 + -0x18);
      local_1c8.data._M_elems._48_8_ = *(undefined8 *)puVar2;
      uVar4 = *(undefined8 *)(puVar2 + 2);
      local_1c8.data._M_elems._56_5_ = SUB85(uVar4,0);
      local_1c8.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
      local_1c8.exp = *(int *)((long)&(pnVar3->m_backend).data + lVar22 * 8 + -8);
      local_1c8.neg = *(bool *)((long)&(pnVar3->m_backend).data + lVar22 * 8 + -4);
      local_1c8._72_8_ = *(undefined8 *)((long)&(pnVar3->m_backend).data + lVar22 * 8);
      pnVar3 = (this->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).right.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      puVar1 = (undefined8 *)((long)&(pnVar3->m_backend).data + lVar22 * 8 + -0x48);
      local_178 = (undefined1  [8])*puVar1;
      SStack_170.m_elem =
           (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *)puVar1[1];
      puVar1 = (undefined8 *)((long)&(pnVar3->m_backend).data + lVar22 * 8 + -0x38);
      SStack_170._8_8_ = *puVar1;
      pNStack_160 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)puVar1[1];
      puVar2 = (uint *)((long)&(pnVar3->m_backend).data + lVar22 * 8 + -0x28);
      local_158 = *(uint (*) [2])puVar2;
      auStack_150 = *(uint (*) [2])(puVar2 + 2);
      puVar2 = (uint *)((long)&(pnVar3->m_backend).data + lVar22 * 8 + -0x18);
      local_148 = *(uint (*) [2])puVar2;
      auStack_140 = *(uint (*) [2])(puVar2 + 2);
      local_138 = *(int *)((long)&(pnVar3->m_backend).data + lVar22 * 8 + -8);
      local_134 = *(bool *)((long)&(pnVar3->m_backend).data + lVar22 * 8 + -4);
      _local_130 = *(undefined8 *)((long)&(pnVar3->m_backend).data + lVar22 * 8);
      ::soplex::infinity::__tls_init();
      local_118.fpclass = cpp_dec_float_finite;
      local_118.prec_elem = 0x10;
      local_118.data._M_elems[0] = 0;
      local_118.data._M_elems[1] = 0;
      local_118.data._M_elems[2] = 0;
      local_118.data._M_elems[3] = 0;
      local_118.data._M_elems[4] = 0;
      local_118.data._M_elems[5] = 0;
      local_118.data._M_elems[6] = 0;
      local_118.data._M_elems[7] = 0;
      local_118.data._M_elems[8] = 0;
      local_118.data._M_elems[9] = 0;
      local_118.data._M_elems[10] = 0;
      local_118.data._M_elems[0xb] = 0;
      local_118.data._M_elems[0xc] = 0;
      local_118.data._M_elems[0xd] = 0;
      local_118.data._M_elems._56_5_ = 0;
      local_118.data._M_elems[0xf]._1_3_ = 0;
      local_118.exp = 0;
      local_118.neg = false;
      boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                ((cpp_dec_float<100u,int,void> *)&local_118,local_c8);
      iVar12 = (int)lVar25;
      if (((local_1c8.fpclass == cpp_dec_float_NaN) || (local_118.fpclass == cpp_dec_float_NaN)) ||
         (iVar13 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                             (&local_1c8,&local_118), iVar13 < 1)) {
LAB_00380e28:
        std::__ostream_insert<char,std::char_traits<char>>(p_output," ",1);
        pcVar20 = LPFgetRowName<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                            (this,iVar12,local_b8,local_48,iVar12);
        if (pcVar20 == (char *)0x0) {
          std::ios::clear(iVar21 + (int)*(undefined8 *)(*(long *)p_output + -0x18));
        }
        else {
          sVar14 = strlen(pcVar20);
          std::__ostream_insert<char,std::char_traits<char>>(p_output,pcVar20,sVar14);
        }
        std::__ostream_insert<char,std::char_traits<char>>(p_output," : ",3);
        pIVar16 = (this->
                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .set.theitem +
                  (this->
                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .set.thekey[lVar25].idx;
        p_lhs = &local_1c8;
      }
      else {
        ::soplex::infinity::__tls_init();
        local_98.fpclass = cpp_dec_float_finite;
        local_98.prec_elem = 0x10;
        local_98.data._M_elems[0] = 0;
        local_98.data._M_elems[1] = 0;
        local_98.data._M_elems[2] = 0;
        local_98.data._M_elems[3] = 0;
        local_98.data._M_elems[4] = 0;
        local_98.data._M_elems[5] = 0;
        local_98.data._M_elems[6] = 0;
        local_98.data._M_elems[7] = 0;
        local_98.data._M_elems[8] = 0;
        local_98.data._M_elems[9] = 0;
        local_98.data._M_elems[10] = 0;
        local_98.data._M_elems[0xb] = 0;
        local_98.data._M_elems[0xc] = 0;
        local_98.data._M_elems[0xd] = 0;
        local_98.data._M_elems._56_5_ = 0;
        local_98.data._M_elems[0xf]._1_3_ = 0;
        local_98.exp = 0;
        local_98.neg = false;
        boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                  ((cpp_dec_float<100u,int,void> *)&local_98,local_a8);
        if ((((local_130 == cpp_dec_float_NaN) || (local_98.fpclass == cpp_dec_float_NaN)) ||
            (iVar13 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                ((cpp_dec_float<100U,_int,_void> *)local_178,&local_98), -1 < iVar13
            )) || (((local_1c8.fpclass != cpp_dec_float_NaN && (local_130 != cpp_dec_float_NaN)) &&
                   (iVar13 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
                             compare(&local_1c8,(cpp_dec_float<100U,_int,_void> *)local_178),
                   iVar13 == 0)))) goto LAB_00380e28;
        std::__ostream_insert<char,std::char_traits<char>>(p_output," ",1);
        pcVar20 = LPFgetRowName<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                            (this,iVar12,local_b8,local_48,iVar12);
        if (pcVar20 == (char *)0x0) {
          std::ios::clear(iVar21 + (int)*(undefined8 *)(*(long *)p_output + -0x18));
        }
        else {
          sVar14 = strlen(pcVar20);
          std::__ostream_insert<char,std::char_traits<char>>(p_output,pcVar20,sVar14);
        }
        std::__ostream_insert<char,std::char_traits<char>>(p_output,"_1 : ",5);
        iVar13 = (this->
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .set.thekey[lVar25].idx;
        pIVar16 = (this->
                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .set.theitem;
        ::soplex::infinity::__tls_init();
        local_118.fpclass = cpp_dec_float_finite;
        local_118.prec_elem = 0x10;
        local_118.data._M_elems[0] = 0;
        local_118.data._M_elems[1] = 0;
        local_118.data._M_elems[2] = 0;
        local_118.data._M_elems[3] = 0;
        local_118.data._M_elems[4] = 0;
        local_118.data._M_elems[5] = 0;
        local_118.data._M_elems[6] = 0;
        local_118.data._M_elems[7] = 0;
        local_118.data._M_elems[8] = 0;
        local_118.data._M_elems[9] = 0;
        local_118.data._M_elems[10] = 0;
        local_118.data._M_elems[0xb] = 0;
        local_118.data._M_elems[0xc] = 0;
        local_118.data._M_elems[0xd] = 0;
        local_118.data._M_elems._56_5_ = 0;
        local_118.data._M_elems[0xf]._1_3_ = 0;
        local_118.exp = 0;
        local_118.neg = false;
        boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                  ((cpp_dec_float<100u,int,void> *)&local_118,local_a8);
        LPFwriteRow<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  (this,p_output,p_cnames,
                   (SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *)(pIVar16 + iVar13),
                   (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&local_1c8,
                   (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&local_118);
        std::__ostream_insert<char,std::char_traits<char>>(p_output," ",1);
        pcVar20 = LPFgetRowName<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                            (this,iVar12,local_b8,local_48,iVar12);
        if (pcVar20 == (char *)0x0) {
          std::ios::clear(iVar21 + (int)*(undefined8 *)(*(long *)p_output + -0x18));
        }
        else {
          sVar14 = strlen(pcVar20);
          std::__ostream_insert<char,std::char_traits<char>>(p_output,pcVar20,sVar14);
        }
        std::__ostream_insert<char,std::char_traits<char>>(p_output,"_2 : ",5);
        pIVar16 = (this->
                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .set.theitem +
                  (this->
                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .set.thekey[lVar25].idx;
        ::soplex::infinity::__tls_init();
        local_118.fpclass = cpp_dec_float_finite;
        local_118.prec_elem = 0x10;
        local_118.data._M_elems[0] = 0;
        local_118.data._M_elems[1] = 0;
        local_118.data._M_elems[2] = 0;
        local_118.data._M_elems[3] = 0;
        local_118.data._M_elems[4] = 0;
        local_118.data._M_elems[5] = 0;
        local_118.data._M_elems[6] = 0;
        local_118.data._M_elems[7] = 0;
        local_118.data._M_elems[8] = 0;
        local_118.data._M_elems[9] = 0;
        local_118.data._M_elems[10] = 0;
        local_118.data._M_elems[0xb] = 0;
        local_118.data._M_elems[0xc] = 0;
        local_118.data._M_elems[0xd] = 0;
        local_118.data._M_elems._56_5_ = 0;
        local_118.data._M_elems[0xf]._1_3_ = 0;
        local_118.exp = 0;
        local_118.neg = false;
        boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                  ((cpp_dec_float<100u,int,void> *)&local_118,local_c8);
        p_lhs = &local_118;
      }
      LPFwriteRow<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                (this,p_output,p_cnames,
                 (SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)pIVar16,
                 (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)p_lhs,(number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)local_178);
      lVar25 = lVar25 + 1;
      lVar22 = lVar22 + 10;
    } while (lVar25 < (this->
                      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .set.thenum);
  }
  std::__ostream_insert<char,std::char_traits<char>>(p_output,"Bounds\n",7);
  if (0 < (this->
          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum) {
    local_b8 = *(NameSet **)(in_FS_OFFSET + -8);
    uStack_b0 = 0;
    local_c8 = -(double)local_b8;
    uStack_c0 = 0;
    uStack_bc = 0x80000000;
    lVar25 = 0x48;
    lVar22 = 0;
    do {
      pnVar3 = (this->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).low.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      puVar1 = (undefined8 *)((long)&(pnVar3->m_backend).data + lVar25 + -0x48);
      local_178 = (undefined1  [8])*puVar1;
      SStack_170.m_elem =
           (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *)puVar1[1];
      puVar1 = (undefined8 *)((long)&(pnVar3->m_backend).data + lVar25 + -0x38);
      SStack_170._8_8_ = *puVar1;
      pNStack_160 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)puVar1[1];
      puVar2 = (uint *)((long)&(pnVar3->m_backend).data + lVar25 + -0x28);
      local_158 = *(uint (*) [2])puVar2;
      auStack_150 = *(uint (*) [2])(puVar2 + 2);
      puVar2 = (uint *)((long)&(pnVar3->m_backend).data + lVar25 + -0x18);
      local_148 = *(uint (*) [2])puVar2;
      auStack_140 = *(uint (*) [2])(puVar2 + 2);
      local_138 = *(int *)((long)&(pnVar3->m_backend).data + lVar25 + -8);
      local_134 = *(bool *)((long)&(pnVar3->m_backend).data + lVar25 + -4);
      _local_130 = *(undefined8 *)((long)&(pnVar3->m_backend).data + lVar25);
      pnVar3 = (this->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).up.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      puVar2 = (uint *)((long)&(pnVar3->m_backend).data + lVar25 + -0x48);
      local_118.data._M_elems._0_8_ = *(undefined8 *)puVar2;
      local_118.data._M_elems._8_8_ = *(undefined8 *)(puVar2 + 2);
      puVar2 = (uint *)((long)&(pnVar3->m_backend).data + lVar25 + -0x38);
      local_118.data._M_elems._16_8_ = *(undefined8 *)puVar2;
      local_118.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
      puVar2 = (uint *)((long)&(pnVar3->m_backend).data + lVar25 + -0x28);
      local_118.data._M_elems._32_8_ = *(undefined8 *)puVar2;
      local_118.data._M_elems._40_8_ = *(undefined8 *)(puVar2 + 2);
      puVar2 = (uint *)((long)&(pnVar3->m_backend).data + lVar25 + -0x18);
      local_118.data._M_elems._48_8_ = *(undefined8 *)puVar2;
      uVar4 = *(undefined8 *)(puVar2 + 2);
      local_118.data._M_elems._56_5_ = SUB85(uVar4,0);
      local_118.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
      local_118.exp = *(int *)((long)&(pnVar3->m_backend).data + lVar25 + -8);
      local_118.neg = *(bool *)((long)&(pnVar3->m_backend).data + lVar25 + -4);
      local_118._72_8_ = *(undefined8 *)((long)&(pnVar3->m_backend).data + lVar25);
      iVar12 = (int)lVar22;
      if ((((fpclass_type)_local_130 == cpp_dec_float_NaN) ||
          (local_118.fpclass == cpp_dec_float_NaN)) ||
         (iVar13 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                             ((cpp_dec_float<100U,_int,_void> *)local_178,&local_118), iVar13 != 0))
      {
        ::soplex::infinity::__tls_init();
        local_1c8.fpclass = cpp_dec_float_finite;
        local_1c8.prec_elem = 0x10;
        local_1c8.data._M_elems[0] = 0;
        local_1c8.data._M_elems[1] = 0;
        local_1c8.data._M_elems[2] = 0;
        local_1c8.data._M_elems[3] = 0;
        local_1c8.data._M_elems[4] = 0;
        local_1c8.data._M_elems[5] = 0;
        local_1c8.data._M_elems[6] = 0;
        local_1c8.data._M_elems[7] = 0;
        local_1c8.data._M_elems[8] = 0;
        local_1c8.data._M_elems[9] = 0;
        local_1c8.data._M_elems[10] = 0;
        local_1c8.data._M_elems[0xb] = 0;
        local_1c8.data._M_elems[0xc] = 0;
        local_1c8.data._M_elems[0xd] = 0;
        local_1c8.data._M_elems._56_5_ = 0;
        local_1c8.data._M_elems[0xf]._1_3_ = 0;
        local_1c8.exp = 0;
        local_1c8.neg = false;
        boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                  ((cpp_dec_float<100u,int,void> *)&local_1c8,local_c8);
        if (((local_130 == cpp_dec_float_NaN) || (local_1c8.fpclass == cpp_dec_float_NaN)) ||
           (iVar13 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                               ((cpp_dec_float<100U,_int,_void> *)local_178,&local_1c8), iVar13 < 1)
           ) {
          ::soplex::infinity::__tls_init();
          local_1c8.fpclass = cpp_dec_float_finite;
          local_1c8.prec_elem = 0x10;
          local_1c8.data._M_elems[0] = 0;
          local_1c8.data._M_elems[1] = 0;
          local_1c8.data._M_elems[2] = 0;
          local_1c8.data._M_elems[3] = 0;
          local_1c8.data._M_elems[4] = 0;
          local_1c8.data._M_elems[5] = 0;
          local_1c8.data._M_elems[6] = 0;
          local_1c8.data._M_elems[7] = 0;
          local_1c8.data._M_elems[8] = 0;
          local_1c8.data._M_elems[9] = 0;
          local_1c8.data._M_elems[10] = 0;
          local_1c8.data._M_elems[0xb] = 0;
          local_1c8.data._M_elems[0xc] = 0;
          local_1c8.data._M_elems[0xd] = 0;
          local_1c8.data._M_elems._56_5_ = 0;
          local_1c8.data._M_elems[0xf]._1_3_ = 0;
          local_1c8.exp = 0;
          local_1c8.neg = false;
          boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                    ((cpp_dec_float<100u,int,void> *)&local_1c8,(double)local_b8);
          if (((local_118.fpclass != cpp_dec_float_NaN) && (local_1c8.fpclass != cpp_dec_float_NaN))
             && (iVar13 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                    (&local_118,&local_1c8), iVar13 < 0)) {
            lVar17 = 0xb;
            pcVar20 = "   -Inf <= ";
LAB_0038157c:
            std::__ostream_insert<char,std::char_traits<char>>(p_output,pcVar20,lVar17);
            pcVar20 = getColName<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                (this,iVar12,p_cnames,(char *)&local_98);
            if (pcVar20 == (char *)0x0) {
              std::ios::clear(iVar21 + (int)*(undefined8 *)(*(long *)p_output + -0x18));
            }
            else {
              sVar14 = strlen(pcVar20);
              std::__ostream_insert<char,std::char_traits<char>>(p_output,pcVar20,sVar14);
            }
            lVar17 = 4;
            pcVar20 = " <= ";
            goto LAB_0038171c;
          }
          std::__ostream_insert<char,std::char_traits<char>>(p_output,"  ",2);
          pcVar20 = getColName<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                              (this,iVar12,p_cnames,(char *)&local_98);
          if (pcVar20 == (char *)0x0) {
            std::ios::clear(iVar21 + (int)*(undefined8 *)(*(long *)p_output + -0x18));
          }
          else {
            sVar14 = strlen(pcVar20);
            std::__ostream_insert<char,std::char_traits<char>>(p_output,pcVar20,sVar14);
          }
          std::__ostream_insert<char,std::char_traits<char>>(p_output," free\n",6);
        }
        else {
          ::soplex::infinity::__tls_init();
          local_1c8.fpclass = cpp_dec_float_finite;
          local_1c8.prec_elem = 0x10;
          local_1c8.data._M_elems[0] = 0;
          local_1c8.data._M_elems[1] = 0;
          local_1c8.data._M_elems[2] = 0;
          local_1c8.data._M_elems[3] = 0;
          local_1c8.data._M_elems[4] = 0;
          local_1c8.data._M_elems[5] = 0;
          local_1c8.data._M_elems[6] = 0;
          local_1c8.data._M_elems[7] = 0;
          local_1c8.data._M_elems[8] = 0;
          local_1c8.data._M_elems[9] = 0;
          local_1c8.data._M_elems[10] = 0;
          local_1c8.data._M_elems[0xb] = 0;
          local_1c8.data._M_elems[0xc] = 0;
          local_1c8.data._M_elems[0xd] = 0;
          local_1c8.data._M_elems._56_5_ = 0;
          local_1c8.data._M_elems[0xf]._1_3_ = 0;
          local_1c8.exp = 0;
          local_1c8.neg = false;
          boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                    ((cpp_dec_float<100u,int,void> *)&local_1c8,(double)local_b8);
          if (((local_118.fpclass != cpp_dec_float_NaN) && (local_1c8.fpclass != cpp_dec_float_NaN))
             && (iVar13 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                    (&local_118,&local_1c8), iVar13 < 0)) {
            if (local_130 != cpp_dec_float_NaN) {
              local_1c8.fpclass = cpp_dec_float_finite;
              local_1c8.prec_elem = 0x10;
              local_1c8.data._M_elems[0] = 0;
              local_1c8.data._M_elems[1] = 0;
              local_1c8.data._M_elems[2] = 0;
              local_1c8.data._M_elems[3] = 0;
              local_1c8.data._M_elems[4] = 0;
              local_1c8.data._M_elems[5] = 0;
              local_1c8.data._M_elems[6] = 0;
              local_1c8.data._M_elems[7] = 0;
              local_1c8.data._M_elems[8] = 0;
              local_1c8.data._M_elems[9] = 0;
              local_1c8.data._M_elems[10] = 0;
              local_1c8.data._M_elems[0xb] = 0;
              local_1c8.data._M_elems[0xc] = 0;
              local_1c8.data._M_elems[0xd] = 0;
              local_1c8.data._M_elems._56_5_ = 0;
              local_1c8.data._M_elems[0xf]._1_3_ = 0;
              local_1c8.exp = 0;
              local_1c8.neg = false;
              iVar13 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                 ((cpp_dec_float<100U,_int,_void> *)local_178,&local_1c8);
              if (iVar13 == 0) {
                lVar17 = 2;
                pcVar20 = "  ";
                goto LAB_0038157c;
              }
            }
            std::__ostream_insert<char,std::char_traits<char>>(p_output,"  ",2);
            poVar15 = boost::multiprecision::operator<<
                                (p_output,(number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                           *)local_178);
            std::__ostream_insert<char,std::char_traits<char>>(poVar15," <= ",4);
            pcVar20 = getColName<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                (this,iVar12,p_cnames,(char *)&local_98);
            if (pcVar20 == (char *)0x0) {
              std::ios::clear((int)poVar15 + (int)*(undefined8 *)(*(long *)poVar15 + -0x18));
            }
            else {
              sVar14 = strlen(pcVar20);
              std::__ostream_insert<char,std::char_traits<char>>(poVar15,pcVar20,sVar14);
            }
            std::__ostream_insert<char,std::char_traits<char>>(poVar15," <= ",4);
            goto LAB_00381724;
          }
          if (local_130 != cpp_dec_float_NaN) {
            local_1c8.fpclass = cpp_dec_float_finite;
            local_1c8.prec_elem = 0x10;
            local_1c8.data._M_elems[0] = 0;
            local_1c8.data._M_elems[1] = 0;
            local_1c8.data._M_elems[2] = 0;
            local_1c8.data._M_elems[3] = 0;
            local_1c8.data._M_elems[4] = 0;
            local_1c8.data._M_elems[5] = 0;
            local_1c8.data._M_elems[6] = 0;
            local_1c8.data._M_elems[7] = 0;
            local_1c8.data._M_elems[8] = 0;
            local_1c8.data._M_elems[9] = 0;
            local_1c8.data._M_elems[10] = 0;
            local_1c8.data._M_elems[0xb] = 0;
            local_1c8.data._M_elems[0xc] = 0;
            local_1c8.data._M_elems[0xd] = 0;
            local_1c8.data._M_elems._56_5_ = 0;
            local_1c8.data._M_elems[0xf]._1_3_ = 0;
            local_1c8.exp = 0;
            local_1c8.neg = false;
            iVar13 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                               ((cpp_dec_float<100U,_int,_void> *)local_178,&local_1c8);
            if (iVar13 == 0) goto LAB_0038174b;
          }
          std::__ostream_insert<char,std::char_traits<char>>(p_output,"  ",2);
          poVar15 = boost::multiprecision::operator<<
                              (p_output,(number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                         *)local_178);
          std::__ostream_insert<char,std::char_traits<char>>(poVar15," <= ",4);
          pcVar20 = getColName<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                              (this,iVar12,p_cnames,(char *)&local_98);
          if (pcVar20 == (char *)0x0) {
            std::ios::clear((int)poVar15 + (int)*(undefined8 *)(*(long *)poVar15 + -0x18));
          }
          else {
            sVar14 = strlen(pcVar20);
            std::__ostream_insert<char,std::char_traits<char>>(poVar15,pcVar20,sVar14);
          }
          local_1c8.data._M_elems[0]._0_1_ = 10;
          std::__ostream_insert<char,std::char_traits<char>>(poVar15,(char *)&local_1c8,1);
        }
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>(p_output,"  ",2);
        pcVar20 = getColName<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                            (this,iVar12,p_cnames,(char *)&local_98);
        if (pcVar20 == (char *)0x0) {
          std::ios::clear(iVar21 + (int)*(undefined8 *)(*(long *)p_output + -0x18));
        }
        else {
          sVar14 = strlen(pcVar20);
          std::__ostream_insert<char,std::char_traits<char>>(p_output,pcVar20,sVar14);
        }
        lVar17 = 3;
        pcVar20 = " = ";
LAB_0038171c:
        std::__ostream_insert<char,std::char_traits<char>>(p_output,pcVar20,lVar17);
        poVar15 = p_output;
LAB_00381724:
        poVar15 = boost::multiprecision::operator<<
                            (poVar15,(number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                      *)&local_118);
        local_1c8.data._M_elems[0]._0_1_ = 10;
        std::__ostream_insert<char,std::char_traits<char>>(poVar15,(char *)&local_1c8,1);
      }
LAB_0038174b:
      lVar22 = lVar22 + 1;
      lVar25 = lVar25 + 0x50;
    } while (lVar22 < (this->
                      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .set.thenum);
  }
  if (((local_120 != (IdxSet *)0x0) && (0 < local_120->num)) &&
     (std::__ostream_insert<char,std::char_traits<char>>(p_output,"Generals\n",9),
     0 < (this->
         super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).
         super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         .set.thenum)) {
    iVar12 = 0;
    do {
      iVar13 = IdxSet::pos(local_120,iVar12);
      if (-1 < iVar13) {
        std::__ostream_insert<char,std::char_traits<char>>(p_output,"  ",2);
        pcVar20 = getColName<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                            (this,iVar12,p_cnames,(char *)&local_1c8);
        if (pcVar20 == (char *)0x0) {
          std::ios::clear(iVar21 + (int)*(undefined8 *)(*(long *)p_output + -0x18));
        }
        else {
          sVar14 = strlen(pcVar20);
          std::__ostream_insert<char,std::char_traits<char>>(p_output,pcVar20,sVar14);
        }
        std::__ostream_insert<char,std::char_traits<char>>(p_output,"\n",1);
      }
      iVar12 = iVar12 + 1;
    } while (iVar12 < (this->
                      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .set.thenum);
  }
  std::__ostream_insert<char,std::char_traits<char>>(p_output,"End",3);
  std::ios::widen((char)*(undefined8 *)(*(long *)p_output + -0x18) + (char)p_output);
  std::ostream::put((char)p_output);
  std::ostream::flush();
  return;
}

Assistant:

inline
void SPxLPBase<R>::writeLPF(
   std::ostream&  p_output,          ///< output stream
   const NameSet* p_rnames,          ///< row names
   const NameSet* p_cnames,          ///< column names
   const DIdxSet* p_intvars,         ///< integer variables
   const bool     writeZeroObjective ///< write zero objective coefficients
) const
{
   SPxOut::setScientific(p_output, 16);

   LPFwriteObjective(*this, p_output, p_cnames, writeZeroObjective);
   LPFwriteRows(*this, p_output, p_rnames, p_cnames);
   LPFwriteBounds(*this, p_output, p_cnames);
   LPFwriteGenerals(*this, p_output, p_cnames, p_intvars);

   p_output << "End" << std::endl;
}